

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlIO.c
# Opt level: O1

int xmlOutputBufferWrite(xmlOutputBufferPtr out,int len,char *buf)

{
  xmlOutputWriteCallback p_Var1;
  void *pvVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  xmlBufPtr pxVar6;
  size_t sVar7;
  xmlChar *pxVar8;
  xmlBufPtr *ppxVar9;
  int iVar10;
  int iVar11;
  ulong uVar12;
  
  if ((out == (xmlOutputBufferPtr)0x0) || (out->error != 0)) {
LAB_0019f499:
    iVar11 = -1;
  }
  else if (len < 0) {
    iVar11 = 0;
  }
  else {
    iVar11 = 0;
    do {
      uVar12 = 16000;
      if (len < 16000) {
        uVar12 = (ulong)(uint)len;
      }
      iVar10 = (int)uVar12;
      if (out->encoder == (xmlCharEncodingHandlerPtr)0x0) {
        iVar4 = xmlBufAdd(out->buffer,(xmlChar *)buf,iVar10);
        iVar3 = iVar10;
        if (iVar4 != 0) goto LAB_0019f499;
      }
      else {
        if (out->conv == (xmlBufPtr)0x0) {
          pxVar6 = xmlBufCreate();
          out->conv = pxVar6;
        }
        iVar3 = xmlBufAdd(out->buffer,(xmlChar *)buf,iVar10);
        if (iVar3 != 0) goto LAB_0019f499;
        sVar7 = xmlBufUse(out->buffer);
        if (sVar7 < 4000 && len < 0x3e81) {
          return iVar11;
        }
        iVar3 = xmlCharEncOutput(out,0);
        if (iVar3 != -3 && iVar3 < 0) {
          iVar11 = 0x608;
          __xmlSimpleError(8,0x608,(xmlNodePtr)0x0,"encoder error",(char *)0x0);
          uVar5 = 0xffffffff;
          goto LAB_0019f698;
        }
        if (iVar3 < 1) {
          iVar3 = 0;
        }
      }
      len = len - iVar10;
      p_Var1 = out->writecallback;
      if (p_Var1 != (xmlOutputWriteCallback)0x0) {
        if (iVar3 < 4000 && len < 1) {
          return iVar11;
        }
        pvVar2 = out->context;
        if (out->encoder == (xmlCharEncodingHandlerPtr)0x0) {
          pxVar8 = xmlBufContent(out->buffer);
          uVar5 = (*p_Var1)(pvVar2,(char *)pxVar8,iVar3);
          ppxVar9 = &out->buffer;
        }
        else {
          pxVar8 = xmlBufContent(out->conv);
          uVar5 = (*p_Var1)(pvVar2,(char *)pxVar8,iVar3);
          ppxVar9 = &out->conv;
        }
        if ((int)uVar5 < 0) {
          iVar11 = 0x60a;
          __xmlSimpleError(8,0x60a,(xmlNodePtr)0x0,"write error",(char *)0x0);
LAB_0019f698:
          out->error = iVar11;
          return uVar5;
        }
        xmlBufShrink(*ppxVar9,(ulong)uVar5);
        iVar10 = out->written + uVar5;
        if ((int)(uVar5 ^ 0x7fffffff) < out->written) {
          iVar10 = 0x7fffffff;
        }
        out->written = iVar10;
      }
      buf = (char *)((xmlChar *)buf + uVar12);
      iVar11 = iVar11 + iVar3;
    } while (0 < len);
  }
  return iVar11;
}

Assistant:

int
xmlOutputBufferWrite(xmlOutputBufferPtr out, int len, const char *buf) {
    int nbchars = 0; /* number of chars to output to I/O */
    int ret;         /* return from function call */
    int written = 0; /* number of char written to I/O so far */
    int chunk;       /* number of byte current processed from buf */

    if ((out == NULL) || (out->error)) return(-1);
    if (len < 0) return(0);
    if (out->error) return(-1);

    do {
	chunk = len;
	if (chunk > 4 * MINLEN)
	    chunk = 4 * MINLEN;

	/*
	 * first handle encoding stuff.
	 */
	if (out->encoder != NULL) {
	    /*
	     * Store the data in the incoming raw buffer
	     */
	    if (out->conv == NULL) {
		out->conv = xmlBufCreate();
	    }
	    ret = xmlBufAdd(out->buffer, (const xmlChar *) buf, chunk);
	    if (ret != 0)
	        return(-1);

	    if ((xmlBufUse(out->buffer) < MINLEN) && (chunk == len))
		goto done;

	    /*
	     * convert as much as possible to the parser reading buffer.
	     */
	    ret = xmlCharEncOutput(out, 0);
	    if ((ret < 0) && (ret != -3)) {
		xmlIOErr(XML_IO_ENCODER, NULL);
		out->error = XML_IO_ENCODER;
		return(-1);
	    }
            nbchars = ret >= 0 ? ret : 0;
	} else {
	    ret = xmlBufAdd(out->buffer, (const xmlChar *) buf, chunk);
	    if (ret != 0)
	        return(-1);
            nbchars = chunk;
	}
	buf += chunk;
	len -= chunk;

	if (out->writecallback) {
            if ((nbchars < MINLEN) && (len <= 0))
                goto done;

	    /*
	     * second write the stuff to the I/O channel
	     */
	    if (out->encoder != NULL) {
		ret = out->writecallback(out->context,
                           (const char *)xmlBufContent(out->conv), nbchars);
		if (ret >= 0)
		    xmlBufShrink(out->conv, ret);
	    } else {
		ret = out->writecallback(out->context,
                           (const char *)xmlBufContent(out->buffer), nbchars);
		if (ret >= 0)
		    xmlBufShrink(out->buffer, ret);
	    }
	    if (ret < 0) {
		xmlIOErr(XML_IO_WRITE, NULL);
		out->error = XML_IO_WRITE;
		return(ret);
	    }
            if (out->written > INT_MAX - ret)
                out->written = INT_MAX;
            else
                out->written += ret;
	}
	written += nbchars;
    } while (len > 0);

done:
#ifdef DEBUG_INPUT
    xmlGenericError(xmlGenericErrorContext,
	    "I/O: wrote %d chars\n", written);
#endif
    return(written);
}